

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateSemaphore
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount
                    ,LONG lMaximumCount,LPCWSTR lpName,HANDLE *phSemaphore)

{
  uint uVar1;
  long *local_70;
  ISynchStateController *pssc;
  SemaphoreImmutableData *pSemaphoreData;
  IPalObject *pobjRegisteredSemaphore;
  IPalObject *pobjSemaphore;
  undefined1 local_48 [4];
  PAL_ERROR palError;
  CObjectAttributes oa;
  HANDLE *phSemaphore_local;
  LPCWSTR lpName_local;
  LONG lMaximumCount_local;
  LONG lInitialCount_local;
  LPSECURITY_ATTRIBUTES lpSemaphoreAttributes_local;
  CPalThread *pthr_local;
  
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)phSemaphore;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_48,lpName,lpSemaphoreAttributes);
  pobjSemaphore._4_4_ = 0;
  pobjRegisteredSemaphore = (IPalObject *)0x0;
  pSemaphoreData = (SemaphoreImmutableData *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x117);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (oa.pSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x118);
    fprintf(_stderr,"Expression: NULL != phSemaphore\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpName == (LPCWSTR)0x0) {
    if (lMaximumCount < 1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pobjSemaphore._4_4_ = 0x57;
    }
    else if ((lInitialCount < 0) || (lMaximumCount < lInitialCount)) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pobjSemaphore._4_4_ = 0x57;
    }
    else {
      pobjSemaphore._4_4_ =
           (**(code **)*g_pObjectManager)
                     (g_pObjectManager,pthr,otSemaphore,local_48,&pobjRegisteredSemaphore);
      if (pobjSemaphore._4_4_ == 0) {
        pobjSemaphore._4_4_ =
             (*pobjRegisteredSemaphore->_vptr_IPalObject[2])(pobjRegisteredSemaphore,&pssc);
        if (pobjSemaphore._4_4_ == 0) {
          *(LONG *)&pssc->_vptr_ISynchStateController = lMaximumCount;
          uVar1 = 0;
          if (lInitialCount != 0) {
            pobjSemaphore._4_4_ =
                 (*pobjRegisteredSemaphore->_vptr_IPalObject[5])
                           (pobjRegisteredSemaphore,pthr,&local_70);
            if (pobjSemaphore._4_4_ == 0) {
              pobjSemaphore._4_4_ = (**(code **)(*local_70 + 8))(local_70,lInitialCount);
              (**(code **)(*local_70 + 0x30))();
            }
            uVar1 = pobjSemaphore._4_4_;
            if (pobjSemaphore._4_4_ != 0) {
              fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                      ,0x160);
              fprintf(_stderr,"Unable to set new semaphore state (%d)\n",(ulong)pobjSemaphore._4_4_)
              ;
              goto LAB_003b9bd8;
            }
          }
          pobjSemaphore._4_4_ = uVar1;
          pobjSemaphore._4_4_ =
               (**(code **)(*g_pObjectManager + 8))
                         (g_pObjectManager,pthr,pobjRegisteredSemaphore,&aotSempahore,0,
                          oa.pSecurityAttributes,&pSemaphoreData);
          pobjRegisteredSemaphore = (IPalObject *)0x0;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x149);
          fprintf(_stderr,"Error %d obtaining object data\n",(ulong)pobjSemaphore._4_4_);
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x126);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    pobjSemaphore._4_4_ = 0x32;
  }
LAB_003b9bd8:
  if (pobjRegisteredSemaphore != (IPalObject *)0x0) {
    (*pobjRegisteredSemaphore->_vptr_IPalObject[8])(pobjRegisteredSemaphore,pthr);
  }
  if (pSemaphoreData != (SemaphoreImmutableData *)0x0) {
    (**(code **)(*(long *)pSemaphoreData + 0x40))(pSemaphoreData,pthr);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjSemaphore._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateSemaphore(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
    LONG lInitialCount,
    LONG lMaximumCount,
    LPCWSTR lpName,
    HANDLE *phSemaphore
    )
{
    CObjectAttributes oa(lpName, lpSemaphoreAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSemaphore = NULL;
    IPalObject *pobjRegisteredSemaphore = NULL;
    SemaphoreImmutableData *pSemaphoreData;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phSemaphore);

    ENTRY("InternalCreateSemaphore(pthr=%p, lpSemaphoreAttributes=%p, "
        "lInitialCount=%d, lMaximumCount=%d, lpName=%p, phSemaphore=%p)\n",
        pthr,
        lpSemaphoreAttributes,
        lInitialCount,
        lMaximumCount,
        lpName,
        phSemaphore
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateSemaphoreExit;
    }

    if (lMaximumCount <= 0)
    {
        ERROR("lMaximumCount is invalid (%d)\n", lMaximumCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    if ((lInitialCount < 0) || (lInitialCount > lMaximumCount))
    {
        ERROR("lInitialCount is invalid (%d)\n", lInitialCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        &otSemaphore,
        &oa,
        &pobjSemaphore
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateSemaphoreExit;
    }

    palError = pobjSemaphore->GetImmutableData(reinterpret_cast<void**>(&pSemaphoreData));

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining object data\n", palError);
        goto InternalCreateSemaphoreExit;
    }

    pSemaphoreData->lMaximumCount = lMaximumCount;

    if (0 != lInitialCount)
    {
        ISynchStateController *pssc;

        palError = pobjSemaphore->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(lInitialCount);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new semaphore state (%d)\n", palError);
            goto InternalCreateSemaphoreExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjSemaphore,
        &aotSempahore,
        0, // Should be SEMAPHORE_ALL_ACCESS; currently ignored (no Win32 security)
        phSemaphore,
        &pobjRegisteredSemaphore
        );

    //
    // pobjSemaphore is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pobjSemaphore = NULL;

InternalCreateSemaphoreExit:

    if (NULL != pobjSemaphore)
    {
        pobjSemaphore->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredSemaphore)
    {
        pobjRegisteredSemaphore->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateSemaphore returns %d\n", palError);

    return palError;
}